

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

AssignmentStatement * __thiscall Parser::assignStmt(Parser *this,ExprNode *id)

{
  code *pcVar1;
  bool bVar2;
  Token local_470;
  string local_400;
  ExprNode *local_3e0;
  ExprNode *rightHandSideExpr_1;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  Token local_318;
  ExprNode *local_2a8;
  ExprNode *subscription;
  Token local_298;
  string local_228;
  Testlist *local_208;
  Testlist *arrayTestlist;
  Token local_1f8;
  string local_188;
  ExprNode *local_168;
  ExprNode *rightHandSideExpr;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_90 [8];
  Token openBrace;
  ExprNode *id_local;
  Parser *this_local;
  
  openBrace._string.field_2._8_8_ = id;
  Tokenizer::getToken((Token *)local_90,this->tokenizer);
  bVar2 = Token::isOpenBrace((Token *)local_90);
  if (bVar2) {
    Tokenizer::ungetToken(this->tokenizer);
    local_2a8 = sub(this);
    Tokenizer::getToken(&local_318,this->tokenizer);
    Token::operator=((Token *)local_90,&local_318);
    Token::~Token(&local_318);
    bVar2 = Token::isAssignmentOperator((Token *)local_90);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_338,"Parser::assignStmt",&local_339);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,"Expected an equal sign, instead got",&local_361);
      die(this,&local_338,&local_360,(Token *)local_90);
      std::__cxx11::string::~string((string *)&local_360);
      std::allocator<char>::~allocator(&local_361);
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator(&local_339);
    }
    Tokenizer::getToken((Token *)&rightHandSideExpr_1,this->tokenizer);
    Token::operator=((Token *)local_90,(Token *)&rightHandSideExpr_1);
    Token::~Token((Token *)&rightHandSideExpr_1);
    bVar2 = Token::isOpenBrace((Token *)local_90);
    if (bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    Tokenizer::ungetToken(this->tokenizer);
    local_3e0 = test(this);
    this_local = (Parser *)operator_new(0xf0);
    ExprNode::token(&local_470,(ExprNode *)openBrace._string.field_2._8_8_);
    Token::getName_abi_cxx11_(&local_400,&local_470);
    AssignmentStatement::AssignmentStatement
              ((AssignmentStatement *)this_local,&local_400,local_2a8,local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
    Token::~Token(&local_470);
  }
  else {
    bVar2 = Token::isAssignmentOperator((Token *)local_90);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"Parser::assignStmt",&local_c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Expected an equal sign, instead got",&local_e9);
      die(this,&local_c0,&local_e8,(Token *)local_90);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
    }
    Tokenizer::getToken((Token *)&rightHandSideExpr,this->tokenizer);
    Token::operator=((Token *)local_90,(Token *)&rightHandSideExpr);
    Token::~Token((Token *)&rightHandSideExpr);
    bVar2 = Token::isOpenBrace((Token *)local_90);
    if (bVar2) {
      local_208 = arrayInit(this);
      this_local = (Parser *)operator_new(0xf0);
      subscription._7_1_ = 1;
      ExprNode::token(&local_298,(ExprNode *)openBrace._string.field_2._8_8_);
      Token::getName_abi_cxx11_(&local_228,&local_298);
      AssignmentStatement::AssignmentStatement
                ((AssignmentStatement *)this_local,&local_228,local_208);
      subscription._7_1_ = 0;
      std::__cxx11::string::~string((string *)&local_228);
      Token::~Token(&local_298);
    }
    else {
      Tokenizer::ungetToken(this->tokenizer);
      local_168 = test(this);
      this_local = (Parser *)operator_new(0xf0);
      arrayTestlist._7_1_ = 1;
      ExprNode::token(&local_1f8,(ExprNode *)openBrace._string.field_2._8_8_);
      Token::getName_abi_cxx11_(&local_188,&local_1f8);
      AssignmentStatement::AssignmentStatement
                ((AssignmentStatement *)this_local,&local_188,local_168);
      arrayTestlist._7_1_ = 0;
      std::__cxx11::string::~string((string *)&local_188);
      Token::~Token(&local_1f8);
    }
  }
  arrayTestlist._0_4_ = 1;
  Token::~Token((Token *)local_90);
  return (AssignmentStatement *)this_local;
}

Assistant:

AssignmentStatement *Parser::assignStmt(ExprNode *id) {

    //assign_stmt: ID '=' test

//    Token varName = tokenizer.getToken();
//    if (!varName.isName())
//        die("Parser::assignStmt", "Expected a name token, instead got", varName);
    Token openBrace = tokenizer.getToken();
    if (!openBrace.isOpenBrace()) { // ID =
        if (!openBrace.isAssignmentOperator())
            die("Parser::assignStmt", "Expected an equal sign, instead got", openBrace);
        openBrace = tokenizer.getToken();
        if (!openBrace.isOpenBrace()) {
            tokenizer.ungetToken();
            ExprNode *rightHandSideExpr = test();
            return new AssignmentStatement(id->token().getName(), rightHandSideExpr);
        } else{
            Testlist *arrayTestlist = arrayInit();
//            Token closeBrace = tokenizer.getToken();
//            if (!closeBrace.isCloseBrace())
//                die("Parser::assignStmt", "Expected an ] sign, instead got", closeBrace);
            return new AssignmentStatement(id->token().getName(), arrayTestlist);
        }
    }else{ //  ID[...] =
        tokenizer.ungetToken();
        ExprNode *subscription = sub();
        openBrace = tokenizer.getToken();
        if (!openBrace.isAssignmentOperator())
            die("Parser::assignStmt", "Expected an equal sign, instead got", openBrace);
        openBrace = tokenizer.getToken();
        if (!openBrace.isOpenBrace()) { // test
            tokenizer.ungetToken();
            ExprNode *rightHandSideExpr = test();
            return new AssignmentStatement(id->token().getName(), subscription, rightHandSideExpr);
        }
//        } else{ // [...]
//            Testlist *arrayTestlist = arrayInit();
////            Token closeBrace = tokenizer.getToken();
////            if (!closeBrace.isCloseBrace())
////                die("Parser::assignStmt", "Expected an ] sign, instead got", closeBrace);
//            return new AssignmentStatement(id->token().getName(),subscription, arrayTestlist);
//        }
    }





}